

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void read_archive(bsdtar *bsdtar,char mode,archive *writer)

{
  char **ppcVar1;
  FILE *pFVar2;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  archive *a;
  size_t sVar6;
  undefined8 *puVar7;
  char *pcVar8;
  int *piVar9;
  int iVar10;
  char *pcVar11;
  undefined7 in_register_00000031;
  archive_entry *entry;
  progress_data progress_data;
  archive_entry *local_68;
  undefined4 local_60;
  int local_5c;
  FILE *local_58;
  archive *local_50;
  bsdtar *local_48;
  archive *local_40;
  archive_entry *local_38;
  
  local_60 = (undefined4)CONCAT71(in_register_00000031,mode);
  pcVar8 = *bsdtar->argv;
  local_50 = writer;
  while (pcVar8 != (char *)0x0) {
    wVar3 = archive_match_include_pattern(bsdtar->matching,pcVar8);
    if (wVar3 != L'\0') goto LAB_0010da00;
    ppcVar1 = bsdtar->argv;
    bsdtar->argv = ppcVar1 + 1;
    pcVar8 = ppcVar1[1];
  }
  if ((bsdtar->names_from_file != (char *)0x0) &&
     (wVar3 = archive_match_include_pattern_from_file
                        (bsdtar->matching,bsdtar->names_from_file,bsdtar->flags & 0x100),
     wVar3 != L'\0')) {
LAB_0010da00:
    pcVar8 = archive_error_string(bsdtar->matching);
    pcVar11 = "Error inclusion pattern: %s";
    goto LAB_0010da13;
  }
  a = archive_read_new();
  iVar4 = cset_read_support_filter_program(bsdtar->cset,a);
  if (iVar4 == 0) {
    archive_read_support_filter_all(a);
  }
  archive_read_support_format_all(a);
  pcVar8 = getenv("TAR_READER_OPTIONS");
  if (pcVar8 == (char *)0x0) {
LAB_0010d4ef:
    wVar3 = archive_read_set_options(a,bsdtar->option_options);
    if ((wVar3 == L'\0') &&
       (((bsdtar->flags & 0x10) == 0 ||
        (wVar3 = archive_read_set_options(a,"read_concatenated_archives"), wVar3 == L'\0')))) {
      if (bsdtar->passphrase == (char *)0x0) {
        iVar4 = archive_read_set_passphrase_callback(a,bsdtar,passphrase_callback);
      }
      else {
        iVar4 = archive_read_add_passphrase(a,bsdtar->passphrase);
      }
      if (iVar4 == 0) {
        wVar3 = archive_read_open_filename(a,bsdtar->filename,(long)bsdtar->bytes_per_block);
        if (wVar3 == L'\0') {
          do_chdir(bsdtar);
          if ((((char)local_60 != 'x') ||
              (local_48 = bsdtar, local_40 = a,
              archive_read_extract_set_progress_callback(a,progress_func,&local_48),
              (bsdtar->flags & 4) == 0)) || (iVar4 = chroot("."), iVar4 == 0)) {
LAB_0010d5b9:
            do {
              do {
                while( true ) {
                  do {
                    while( true ) {
                      while( true ) {
                        if (((bsdtar->flags & 8) != 0) &&
                           (wVar3 = archive_match_path_unmatched_inclusions(bsdtar->matching),
                           wVar3 == L'\0')) goto LAB_0010d975;
                        uVar5 = archive_read_next_header(a,&local_68);
                        local_38 = local_68;
                        if (uVar5 == 1) goto LAB_0010d975;
                        if ((int)uVar5 < 0) {
                          pcVar8 = archive_error_string(a);
                          lafe_warnc(0,"%s",pcVar8);
                          if (uVar5 < 0xffffffed) {
                            bsdtar->return_value = 1;
                          }
                        }
                        if (uVar5 != 0xfffffff6) break;
                        lafe_warnc(0,"Retrying...");
                      }
                      if (uVar5 == 0xffffffe2) goto LAB_0010d975;
                      pcVar8 = archive_entry_pathname(local_68);
                      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) break;
                      lafe_warnc(0,"Archive entry has empty or unreadable filename ... skipping.");
                      bsdtar->return_value = 1;
                    }
                    if (-1 < (long)bsdtar->uid) {
                      archive_entry_set_uid(local_68,(long)bsdtar->uid);
                      archive_entry_set_uname(local_68,(char *)0x0);
                    }
                    if (-1 < (long)bsdtar->gid) {
                      archive_entry_set_gid(local_68,(long)bsdtar->gid);
                      archive_entry_set_gname(local_68,(char *)0x0);
                    }
                    if (bsdtar->uname != (char *)0x0) {
                      archive_entry_set_uname(local_68,bsdtar->uname);
                    }
                    if (bsdtar->gname != (char *)0x0) {
                      archive_entry_set_gname(local_68,bsdtar->gname);
                    }
                    wVar3 = archive_match_excluded(bsdtar->matching,local_68);
                  } while (wVar3 != L'\0');
                  if ((char)local_60 != 't') break;
                  puVar7 = (undefined8 *)&stderr;
                  if ((bsdtar->flags & 0x800) == 0) {
                    puVar7 = (undefined8 *)&stdout;
                  }
                  pFVar2 = (FILE *)*puVar7;
                  if (bsdtar->verbose < 2) {
                    pcVar8 = archive_entry_pathname(local_68);
                    safe_fprintf((FILE_conflict *)pFVar2,"%s",pcVar8);
                  }
                  else {
                    list_item_verbose(bsdtar,(FILE_conflict *)pFVar2,local_68);
                  }
                  fflush(pFVar2);
                  iVar4 = archive_read_data_skip(a);
                  if ((iVar4 == -0x14) || (iVar4 == -10)) {
                    fputc(10,pFVar2);
                    pcVar8 = archive_error_string(a);
                    lafe_warnc(0,"%s",pcVar8);
                  }
                  else if (iVar4 == -0x1e) {
                    fputc(10,pFVar2);
                    pcVar8 = archive_error_string(a);
                    lafe_warnc(0,"%s",pcVar8);
                    bsdtar->return_value = 1;
                    goto LAB_0010d975;
                  }
                  fputc(10,pFVar2);
                }
                wVar3 = edit_pathname(bsdtar,local_68);
              } while (wVar3 != L'\0');
              if ((bsdtar->flags & 0x20) != 0) {
                archive_entry_pathname(local_68);
                wVar3 = yes("extract \'%s\'");
                if (wVar3 == L'\0') goto LAB_0010d5b9;
              }
              pFVar2 = _stderr;
              if (bsdtar->verbose < 2) {
                if (bsdtar->verbose == 1) {
                  pcVar8 = archive_entry_pathname(local_68);
                  safe_fprintf((FILE_conflict *)pFVar2,"x %s",pcVar8);
                  goto LAB_0010d84d;
                }
              }
              else {
                safe_fprintf((FILE_conflict *)_stderr,"x ");
                list_item_verbose(bsdtar,(FILE_conflict *)_stderr,local_68);
LAB_0010d84d:
                fflush(_stderr);
              }
              if ((bsdtar->flags & 0x800) == 0) {
                iVar4 = archive_read_extract2(a,local_68,local_50);
              }
              else {
                iVar4 = archive_read_data_into_fd(a,1);
              }
              pFVar2 = _stderr;
              iVar10 = bsdtar->verbose;
              if (iVar4 != 0) {
                local_5c = iVar4;
                if (iVar10 == 0) {
                  pcVar8 = archive_entry_pathname(local_68);
                  safe_fprintf((FILE_conflict *)pFVar2,"%s",pcVar8);
                }
                local_58 = _stderr;
                pcVar8 = archive_error_string(a);
                iVar4 = archive_errno(a);
                pcVar11 = strerror(iVar4);
                safe_fprintf((FILE_conflict *)local_58,": %s: %s",pcVar8,pcVar11);
                iVar10 = bsdtar->verbose;
                if (iVar10 == 0) {
                  fputc(10,_stderr);
                  iVar10 = bsdtar->verbose;
                }
                bsdtar->return_value = 1;
                iVar4 = local_5c;
              }
              if (iVar10 != 0) {
                fputc(10,_stderr);
              }
              if (iVar4 == -0x1e) {
LAB_0010d975:
                iVar4 = archive_read_close(a);
                if (iVar4 != 0) {
                  pcVar8 = archive_error_string(a);
                  lafe_warnc(0,"%s",pcVar8);
                  if (iVar4 < -0x13) {
                    bsdtar->return_value = 1;
                  }
                }
                pFVar2 = _stdout;
                if (2 < bsdtar->verbose) {
                  pcVar8 = archive_format_name(a);
                  pcVar11 = archive_filter_name(a,0);
                  fprintf(pFVar2,"Archive Format: %s,  Compression: %s\n",pcVar8,pcVar11);
                }
                archive_read_free(a);
                return;
              }
            } while( true );
          }
          piVar9 = __errno_location();
          iVar4 = *piVar9;
          pcVar8 = "Can\'t chroot to \".\"";
LAB_0010da64:
          lafe_errc(1,iVar4,pcVar8);
        }
        pcVar8 = archive_error_string(a);
        pcVar11 = "Error opening archive: %s";
        goto LAB_0010da13;
      }
    }
  }
  else {
    sVar6 = strlen(pcVar8);
    pcVar11 = (char *)malloc(sVar6 + 0x1e);
    if (pcVar11 == (char *)0x0) {
      piVar9 = __errno_location();
      iVar4 = *piVar9;
      pcVar8 = "Out of memory";
      goto LAB_0010da64;
    }
    builtin_strncpy(pcVar11,"__ignore_wrong_module_name__,",0x1d);
    memcpy(pcVar11 + 0x1d,pcVar8,sVar6 + 1);
    wVar3 = archive_read_set_options(a,pcVar11);
    free(pcVar11);
    if (wVar3 != L'\xffffffe2') {
      archive_clear_error(a);
      goto LAB_0010d4ef;
    }
  }
  pcVar8 = archive_error_string(a);
  pcVar11 = "%s";
LAB_0010da13:
  lafe_errc(1,0,pcVar11,pcVar8);
}

Assistant:

static void
read_archive(struct bsdtar *bsdtar, char mode, struct archive *writer)
{
	struct progress_data	progress_data;
	FILE			 *out;
	struct archive		 *a;
	struct archive_entry	 *entry;
	const char		 *reader_options;
	int			  r;

	while (*bsdtar->argv) {
		if (archive_match_include_pattern(bsdtar->matching,
		    *bsdtar->argv) != ARCHIVE_OK)
			lafe_errc(1, 0, "Error inclusion pattern: %s",
			    archive_error_string(bsdtar->matching));
		bsdtar->argv++;
	}

	if (bsdtar->names_from_file != NULL)
		if (archive_match_include_pattern_from_file(
		    bsdtar->matching, bsdtar->names_from_file,
		    (bsdtar->flags & OPTFLAG_NULL)) != ARCHIVE_OK)
			lafe_errc(1, 0, "Error inclusion pattern: %s",
			    archive_error_string(bsdtar->matching));

	a = archive_read_new();
	if (cset_read_support_filter_program(bsdtar->cset, a) == 0)
		archive_read_support_filter_all(a);
	archive_read_support_format_all(a);

	reader_options = getenv(ENV_READER_OPTIONS);
	if (reader_options != NULL) {
		size_t module_len = sizeof(IGNORE_WRONG_MODULE_NAME) - 1;
		size_t opt_len = strlen(reader_options) + 1;
		char *p;
		/* Set default read options. */
		if ((p = malloc(module_len + opt_len)) == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or  modules which are not added to
		 *  the archive read object. */
		memcpy(p, IGNORE_WRONG_MODULE_NAME, module_len);
		memcpy(p + module_len, reader_options, opt_len);
		r = archive_read_set_options(a, p);
		free(p);
		if (r == ARCHIVE_FATAL)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
	if (ARCHIVE_OK != archive_read_set_options(a, bsdtar->option_options))
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (bsdtar->flags & OPTFLAG_IGNORE_ZEROS)
		if (archive_read_set_options(a,
		    "read_concatenated_archives") != ARCHIVE_OK)
			lafe_errc(1, 0, "%s", archive_error_string(a));
	if (bsdtar->passphrase != NULL)
		r = archive_read_add_passphrase(a, bsdtar->passphrase);
	else
		r = archive_read_set_passphrase_callback(a, bsdtar,
			&passphrase_callback);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (archive_read_open_filename(a, bsdtar->filename,
					bsdtar->bytes_per_block))
		lafe_errc(1, 0, "Error opening archive: %s",
		    archive_error_string(a));

	do_chdir(bsdtar);

	if (mode == 'x') {
		/* Set an extract callback so that we can handle SIGINFO. */
		progress_data.bsdtar = bsdtar;
		progress_data.archive = a;
		archive_read_extract_set_progress_callback(a, progress_func,
		    &progress_data);
	}

	if (mode == 'x' && (bsdtar->flags & OPTFLAG_CHROOT)) {
#if HAVE_CHROOT
		if (chroot(".") != 0)
			lafe_errc(1, errno, "Can't chroot to \".\"");
#else
		lafe_errc(1, 0,
		    "chroot isn't supported on this platform");
#endif
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	if (mode == 'x' && (bsdtar->flags & OPTFLAG_STDOUT)) {
		_setmode(1, _O_BINARY);
	}
#endif

	for (;;) {
		/* Support --fast-read option */
		const char *p;
		if ((bsdtar->flags & OPTFLAG_FAST_READ) &&
		    archive_match_path_unmatched_inclusions(bsdtar->matching) == 0)
			break;

		r = archive_read_next_header(a, &entry);
		progress_data.entry = entry;
		if (r == ARCHIVE_EOF)
			break;
		if (r < ARCHIVE_OK)
			lafe_warnc(0, "%s", archive_error_string(a));
		if (r <= ARCHIVE_WARN)
			bsdtar->return_value = 1;
		if (r == ARCHIVE_RETRY) {
			/* Retryable error: try again */
			lafe_warnc(0, "Retrying...");
			continue;
		}
		if (r == ARCHIVE_FATAL)
			break;
		p = archive_entry_pathname(entry);
		if (p == NULL || p[0] == '\0') {
			lafe_warnc(0, "Archive entry has empty or unreadable filename ... skipping.");
			bsdtar->return_value = 1;
			continue;
		}

		if (bsdtar->uid >= 0) {
			archive_entry_set_uid(entry, bsdtar->uid);
			archive_entry_set_uname(entry, NULL);
		}
		if (bsdtar->gid >= 0) {
			archive_entry_set_gid(entry, bsdtar->gid);
			archive_entry_set_gname(entry, NULL);
		}
		if (bsdtar->uname)
			archive_entry_set_uname(entry, bsdtar->uname);
		if (bsdtar->gname)
			archive_entry_set_gname(entry, bsdtar->gname);

		/*
		 * Note that pattern exclusions are checked before
		 * pathname rewrites are handled.  This gives more
		 * control over exclusions, since rewrites always lose
		 * information.  (For example, consider a rewrite
		 * s/foo[0-9]/foo/.  If we check exclusions after the
		 * rewrite, there would be no way to exclude foo1/bar
		 * while allowing foo2/bar.)
		 */
		if (archive_match_excluded(bsdtar->matching, entry))
			continue; /* Excluded by a pattern test. */

		if (mode == 't') {
			/* Perversely, gtar uses -O to mean "send to stderr"
			 * when used with -t. */
			out = (bsdtar->flags & OPTFLAG_STDOUT) ?
			    stderr : stdout;

			/*
			 * TODO: Provide some reasonable way to
			 * preview rewrites.  gtar always displays
			 * the unedited path in -t output, which means
			 * you cannot easily preview rewrites.
			 */
			if (bsdtar->verbose < 2)
				safe_fprintf(out, "%s",
				    archive_entry_pathname(entry));
			else
				list_item_verbose(bsdtar, out, entry);
			fflush(out);
			r = archive_read_data_skip(a);
			if (r == ARCHIVE_WARN) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
			}
			if (r == ARCHIVE_RETRY) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
			}
			if (r == ARCHIVE_FATAL) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
				bsdtar->return_value = 1;
				break;
			}
			fprintf(out, "\n");
		} else {
			/* Note: some rewrite failures prevent extraction. */
			if (edit_pathname(bsdtar, entry))
				continue; /* Excluded by a rewrite failure. */

			if ((bsdtar->flags & OPTFLAG_INTERACTIVE) &&
			    !yes("extract '%s'", archive_entry_pathname(entry)))
				continue;

			if (bsdtar->verbose > 1) {
				/* GNU tar uses -tv format with -xvv */
				safe_fprintf(stderr, "x ");
				list_item_verbose(bsdtar, stderr, entry);
				fflush(stderr);
			} else if (bsdtar->verbose > 0) {
				/* Format follows SUSv2, including the
				 * deferred '\n'. */
				safe_fprintf(stderr, "x %s",
				    archive_entry_pathname(entry));
				fflush(stderr);
			}

			/* TODO siginfo_printinfo(bsdtar, 0); */

			if (bsdtar->flags & OPTFLAG_STDOUT)
				r = archive_read_data_into_fd(a, 1);
			else
				r = archive_read_extract2(a, entry, writer);
			if (r != ARCHIVE_OK) {
				if (!bsdtar->verbose)
					safe_fprintf(stderr, "%s", archive_entry_pathname(entry));
				safe_fprintf(stderr, ": %s: %s",
				    archive_error_string(a),
				    strerror(archive_errno(a)));
				if (!bsdtar->verbose)
					fprintf(stderr, "\n");
				bsdtar->return_value = 1;
			}
			if (bsdtar->verbose)
				fprintf(stderr, "\n");
			if (r == ARCHIVE_FATAL)
				break;
		}
	}


	r = archive_read_close(a);
	if (r != ARCHIVE_OK)
		lafe_warnc(0, "%s", archive_error_string(a));
	if (r <= ARCHIVE_WARN)
		bsdtar->return_value = 1;

	if (bsdtar->verbose > 2)
		fprintf(stdout, "Archive Format: %s,  Compression: %s\n",
		    archive_format_name(a), archive_filter_name(a, 0));

	archive_read_free(a);
}